

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UChar32 u_charFromName_63(UCharNameChoice nameChoice,char *name,UErrorCode *pErrorCode)

{
  uint *factors;
  UBool UVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar9;
  ushort uVar10;
  ulong uVar11;
  char *pcVar12;
  UChar32 UVar13;
  uint16_t uVar14;
  char *pcVar15;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  long lVar19;
  UErrorCode UVar20;
  int iVar21;
  bool bVar22;
  uint16_t indexes [8];
  undefined8 local_200;
  char lower [120];
  char *local_178 [8];
  char upper [120];
  FindName findName;
  char *elementBases [8];
  ulong uVar8;
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0xffff;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0xffff;
  }
  UVar20 = U_ILLEGAL_ARGUMENT_ERROR;
  findName.code = 0xffff;
  if ((name == (char *)0x0 || 3 < (int)nameChoice) || (*name == '\0')) goto LAB_00360576;
  UVar1 = icu_63::isDataLoaded(pErrorCode);
  if (UVar1 == '\0') {
    return 0xffff;
  }
  lVar19 = 0;
  do {
    cVar3 = name[lVar19];
    if (cVar3 == '\0') {
      lower[lVar19] = '\0';
      upper[lVar19] = '\0';
      goto LAB_00360565;
    }
    cVar2 = uprv_toupper_63(cVar3);
    upper[lVar19] = cVar2;
    cVar3 = uprv_asciitolower_63(cVar3);
    lower[lVar19] = cVar3;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x78);
  lVar19 = 0x78;
LAB_00360565:
  UVar13 = 0xffff;
  UVar20 = U_ILLEGAL_CHAR_FOUND;
  iVar21 = (int)lVar19;
  findName.code = UVar13;
  if (iVar21 == 0x78) goto LAB_00360576;
  if (lower[0] != '<') {
    iVar21 = *(int *)((long)&icu_63::uCharNames->tokenStringOffset +
                     (ulong)icu_63::uCharNames->algNamesOffset);
    if (iVar21 != 0) {
      puVar17 = (uint *)((long)&icu_63::uCharNames->groupsOffset +
                        (ulong)icu_63::uCharNames->algNamesOffset);
LAB_003606b9:
      uVar18 = 0xffff;
      if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
        if ((char)puVar17[2] == '\x01') {
          factors = puVar17 + 3;
          bVar4 = *(byte *)((long)puVar17 + 9);
          pcVar12 = (char *)((long)puVar17 + (ulong)bVar4 * 2 + 0xd);
          pcVar9 = upper;
          do {
            pcVar15 = pcVar12 + -1;
            if (*pcVar15 == '\0') {
              uVar18 = *puVar17;
              uVar5 = puVar17[1];
              icu_63::writeFactorSuffix
                        ((uint16_t *)factors,(ushort)bVar4,pcVar12,0,indexes,elementBases,local_178,
                         (char *)&findName,0x40);
              iVar6 = strcmp(pcVar9,(char *)&findName);
              if (iVar6 == 0) goto LAB_0036093f;
              uVar18 = uVar18 + 1;
              bVar22 = true;
              if ((int)(uVar5 + 1) <= (int)uVar18) goto LAB_00360941;
              uVar7 = bVar4 - 1 & 0xffff;
              local_200 = (ulong)uVar7;
              uVar8 = (ulong)(uVar7 * 2);
              goto LAB_0036084e;
            }
            pcVar12 = pcVar12 + 1;
            cVar3 = *pcVar9;
            pcVar9 = pcVar9 + 1;
          } while (*pcVar15 == cVar3);
          bVar22 = false;
          uVar18 = 0xffff;
          goto LAB_00360941;
        }
        if ((char)puVar17[2] == '\0') {
          lVar19 = 0;
          do {
            cVar3 = *(char *)((long)puVar17 + lVar19 + 0xc);
            if (cVar3 == '\0') {
              uVar10 = (ushort)*(byte *)((long)puVar17 + 9);
              pcVar9 = upper + lVar19;
              uVar18 = 0;
              if (*(byte *)((long)puVar17 + 9) != 0) goto LAB_00360762;
              goto LAB_00360796;
            }
            pcVar9 = upper + lVar19;
            lVar19 = lVar19 + 1;
          } while (cVar3 == *pcVar9);
          bVar22 = false;
          uVar18 = 0xffff;
          goto LAB_0036095e;
        }
        goto LAB_00360962;
      }
      goto LAB_00360968;
    }
LAB_00360986:
    UVar20 = U_ILLEGAL_CHAR_FOUND;
    findName.otherName = upper;
    findName.code = 0xffff;
    icu_63::enumNames(icu_63::uCharNames,0,0x110000,(UEnumCharNamesFn *)0x0,&findName,nameChoice);
    if (findName.code != 0xffff) {
      return findName.code;
    }
    goto LAB_00360576;
  }
  if (((nameChoice != U_EXTENDED_CHAR_NAME) || (iVar21 - 1U < 3)) ||
     ((lower[iVar21 - 1U] != '>' || (uVar18 = iVar21 - 2, lower[uVar18] == '-'))))
  goto LAB_00360576;
  uVar5 = 2;
  if (2 < uVar18) {
    uVar8 = (ulong)uVar18;
    do {
      uVar11 = uVar8 - 1;
      uVar18 = uVar18 - 1;
      uVar5 = uVar18;
      if (lower[uVar8 - 1] == '-') break;
      uVar8 = uVar11;
    } while (2 < uVar11);
  }
  if ((uVar5 < 2) || (lower[uVar5] != '-')) goto LAB_00360576;
  lower[uVar5] = '\0';
  uVar8 = (ulong)(uVar5 + 1);
  cVar3 = lower[uVar8];
  iVar21 = 0;
  if (cVar3 != '>') {
    uVar5 = uVar5 + 2;
    iVar21 = 0;
    do {
      uVar8 = (ulong)uVar5;
      iVar6 = -0x30;
      if ((9 < (byte)(cVar3 - 0x30U)) && (iVar6 = -0x57, 5 < (byte)(cVar3 + 0x9fU))) {
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        iVar21 = 0xffff;
        goto LAB_003609f3;
      }
      iVar21 = iVar21 * 0x10 + iVar6 + (int)cVar3;
      cVar3 = lower[uVar8];
      uVar5 = uVar5 + 1;
    } while (cVar3 != '>');
  }
  lower[uVar8] = '\0';
  lVar19 = 0;
  do {
    iVar6 = strcmp(lower + 1,*(char **)((long)&icu_63::charCatNames + lVar19));
    if (iVar6 == 0) {
      bVar4 = icu_63::getCharCat(iVar21);
      if ((ulong)bVar4 * 8 == lVar19) goto LAB_003609f3;
      break;
    }
    lVar19 = lVar19 + 8;
  } while (lVar19 != 0x108);
  bVar22 = true;
LAB_003609f5:
  UVar20 = U_ILLEGAL_CHAR_FOUND;
  if (!bVar22) {
    return iVar21;
  }
LAB_00360576:
  *pErrorCode = UVar20;
  return findName.code;
  while (bVar22 = uVar18 != uVar5, uVar18 = uVar18 + 1, bVar22) {
LAB_0036084e:
    uVar14 = *(short *)((long)indexes + uVar8) + 1;
    uVar11 = local_200;
    uVar7 = bVar4 - 2;
    if (*(ushort *)((long)factors + uVar8) <= uVar14) {
      do {
        indexes[uVar11] = 0;
        local_178[uVar11] = elementBases[uVar11];
        uVar11 = (ulong)(uVar7 & 0xffff);
        uVar16 = (ulong)((uVar7 & 0xffff) * 2);
        uVar14 = *(short *)((long)indexes + uVar16) + 1;
        uVar7 = uVar7 - 1;
      } while (*(ushort *)((long)factors + uVar16) <= uVar14);
    }
    indexes[uVar11] = uVar14;
    pcVar12 = local_178[uVar11];
    do {
      cVar3 = *pcVar12;
      pcVar12 = pcVar12 + 1;
    } while (cVar3 != '\0');
    local_178[uVar11] = pcVar12;
    pcVar12 = pcVar9;
    if (bVar4 == 0) {
      bVar22 = true;
    }
    else {
      uVar10 = 0;
      do {
        pcVar15 = local_178[uVar10];
        cVar3 = *pcVar15;
        while (cVar3 != '\0') {
          pcVar15 = pcVar15 + 1;
          if (cVar3 != *pcVar12) {
            pcVar15 = "";
            uVar10 = 99;
          }
          pcVar12 = pcVar12 + 1;
          cVar3 = *pcVar15;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < bVar4);
      bVar22 = uVar10 < 99;
    }
    if ((bVar22) && (*pcVar12 == '\0')) goto LAB_0036093f;
  }
  bVar22 = true;
  uVar18 = uVar5;
LAB_00360941:
  if (bVar22) {
LAB_00360962:
    uVar18 = 0xffff;
  }
LAB_00360968:
  if (uVar18 != 0xffff) {
    return uVar18;
  }
  puVar17 = (uint *)((long)puVar17 + (ulong)*(ushort *)((long)puVar17 + 10));
  iVar21 = iVar21 + -1;
  if (iVar21 == 0) goto LAB_00360986;
  goto LAB_003606b9;
LAB_0036093f:
  bVar22 = false;
  goto LAB_00360941;
  while( true ) {
    pcVar9 = pcVar9 + 1;
    uVar18 = uVar18 << 4 | iVar6 + cVar3;
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) break;
LAB_00360762:
    cVar3 = *pcVar9;
    iVar6 = -0x30;
    if ((9 < (byte)(cVar3 - 0x30U)) && (iVar6 = -0x37, 5 < (byte)(cVar3 + 0xbfU))) {
      uVar18 = 0xffff;
      goto LAB_0036095c;
    }
  }
LAB_00360796:
  if (((*pcVar9 == '\0') && (*puVar17 <= uVar18)) && (uVar18 <= puVar17[1])) {
LAB_0036095c:
    bVar22 = false;
  }
  else {
    bVar22 = true;
  }
LAB_0036095e:
  if (!bVar22) goto LAB_00360968;
  goto LAB_00360962;
LAB_003609f3:
  bVar22 = false;
  goto LAB_003609f5;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_charFromName(UCharNameChoice nameChoice,
               const char *name,
               UErrorCode *pErrorCode) {
    char upper[120], lower[120];
    FindName findName;
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;
    UChar32 cp = 0;
    char c0;
    UChar32 error = 0xffff;     /* Undefined, but use this for backwards compatibility. */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return error;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || name==NULL || *name==0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return error;
    }

    if(!isDataLoaded(pErrorCode)) {
        return error;
    }

    /* construct the uppercase and lowercase of the name first */
    for(i=0; i<sizeof(upper); ++i) {
        if((c0=*name++)!=0) {
            upper[i]=uprv_toupper(c0);
            lower[i]=uprv_tolower(c0);
        } else {
            upper[i]=lower[i]=0;
            break;
        }
    }
    if(i==sizeof(upper)) {
        /* name too long, there is no such character */
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }
    // i==strlen(name)==strlen(lower)==strlen(upper)

    /* try extended names first */
    if (lower[0] == '<') {
        if (nameChoice == U_EXTENDED_CHAR_NAME) {
            // Parse a string like "<category-HHHH>" where HHHH is a hex code point.
            if (lower[--i] == '>' && i >= 3 && lower[--i] != '-') {
                while (i >= 3 && lower[--i] != '-') {}

                if (i >= 2 && lower[i] == '-') {
                    uint32_t cIdx;

                    lower[i] = 0;

                    for (++i; lower[i] != '>'; ++i) {
                        if (lower[i] >= '0' && lower[i] <= '9') {
                            cp = (cp << 4) + lower[i] - '0';
                        } else if (lower[i] >= 'a' && lower[i] <= 'f') {
                            cp = (cp << 4) + lower[i] - 'a' + 10;
                        } else {
                            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                            return error;
                        }
                    }

                    /* Now validate the category name.
                       We could use a binary search, or a trie, if
                       we really wanted to. */

                    for (lower[i] = 0, cIdx = 0; cIdx < UPRV_LENGTHOF(charCatNames); ++cIdx) {

                        if (!uprv_strcmp(lower + 1, charCatNames[cIdx])) {
                            if (getCharCat(cp) == cIdx) {
                                return cp;
                            }
                            break;
                        }
                    }
                }
            }
        }

        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }

    /* try algorithmic names now */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        if((cp=findAlgName(algRange, nameChoice, upper))!=0xffff) {
            return cp;
        }
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }

    /* normal character name */
    findName.otherName=upper;
    findName.code=error;
    enumNames(uCharNames, 0, UCHAR_MAX_VALUE + 1, DO_FIND_NAME, &findName, nameChoice);
    if (findName.code == error) {
         *pErrorCode = U_ILLEGAL_CHAR_FOUND;
    }
    return findName.code;
}